

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

int __thiscall
CVmGramProdState::clone
          (CVmGramProdState *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  vm_obj_id_t extraout_var;
  CVmGramProdState *pCVar1;
  CVmGramProdMem *unaff_retaddr;
  int in_stack_00000010;
  CVmGramProdState *new_enclosing;
  CVmGramProdState *new_state;
  vm_obj_id_t vStack_2c;
  vmgram_alt_info *in_stack_ffffffffffffffe8;
  
  pCVar1 = this;
  if (this->enclosing_ == (CVmGramProdState *)0x0) {
    vStack_2c = 0;
  }
  else {
    clone(this->enclosing_,__fn,__child_stack,__flags,__arg);
    vStack_2c = extraout_var;
  }
  pCVar1 = alloc(unaff_retaddr,(int)((ulong)pCVar1 >> 0x20),(int)pCVar1,(CVmGramProdState *)__fn,
                 in_stack_ffffffffffffffe8,vStack_2c,in_stack_00000010);
  pCVar1->sub_target_prop_ = this->sub_target_prop_;
  if (this->alt_pos_ != 0) {
    memcpy(pCVar1->match_list_,this->match_list_,this->alt_pos_ << 3);
  }
  pCVar1->nxt_ = (CVmGramProdState *)0x0;
  pCVar1->matched_star_ = this->matched_star_;
  return (int)pCVar1;
}

Assistant:

CVmGramProdState *clone(CVmGramProdMem *mem)
    {
        CVmGramProdState *new_state;
        CVmGramProdState *new_enclosing;

        /* clone our enclosing state */
        new_enclosing = (enclosing_ != 0 ? enclosing_->clone(mem) : 0);
        
        /* create a new state object */
        new_state = alloc(mem, tok_pos_, alt_pos_, new_enclosing,
                          altp_, prod_obj_, circular_alt_);

        /* copy the target sub-production property */
        new_state->sub_target_prop_ = sub_target_prop_;

        /* copy the valid portion of my match list */
        if (alt_pos_ != 0)
            memcpy(new_state->match_list_, match_list_,
                   alt_pos_ * sizeof(match_list_[0]));

        /* we're not yet in any queue */
        new_state->nxt_ = 0;

        /* set the '*' flag in the cloned state */
        new_state->matched_star_ = matched_star_;

        /* return the clone */
        return new_state;
    }